

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::date_t,duckdb::dtime_t,duckdb::timestamp_t,duckdb::BinaryStandardOperatorWrapper,duckdb::AddOperator,bool,false,false>
               (date_t *ldata,dtime_t *rdata,timestamp_t *result_data,idx_t count,ValidityMask *mask
               ,bool fun)

{
  unsigned_long *puVar1;
  ulong uVar2;
  timestamp_t tVar3;
  ulong uVar4;
  ulong uVar5;
  idx_t iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      iVar6 = 0;
      do {
        tVar3 = AddOperator::Operation<duckdb::date_t,duckdb::dtime_t,duckdb::timestamp_t>
                          ((date_t)ldata[iVar6].days,rdata[iVar6].micros);
        result_data[iVar6].value = tVar3.value;
        iVar6 = iVar6 + 1;
      } while (count != iVar6);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar4 = 0;
    uVar7 = 0;
    do {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar5 = uVar7 + 0x40;
        if (count <= uVar7 + 0x40) {
          uVar5 = count;
        }
LAB_00967748:
        uVar9 = uVar7;
        if (uVar7 < uVar5) {
          do {
            tVar3 = AddOperator::Operation<duckdb::date_t,duckdb::dtime_t,duckdb::timestamp_t>
                              ((date_t)ldata[uVar7].days,rdata[uVar7].micros);
            result_data[uVar7].value = tVar3.value;
            uVar7 = uVar7 + 1;
            uVar9 = uVar5;
          } while (uVar5 != uVar7);
        }
      }
      else {
        uVar2 = puVar1[uVar4];
        uVar5 = uVar7 + 0x40;
        if (count <= uVar7 + 0x40) {
          uVar5 = count;
        }
        uVar9 = uVar5;
        if (uVar2 != 0) {
          if (uVar2 == 0xffffffffffffffff) goto LAB_00967748;
          uVar9 = uVar7;
          if (uVar7 < uVar5) {
            uVar8 = 0;
            do {
              if ((uVar2 >> (uVar8 & 0x3f) & 1) != 0) {
                tVar3 = AddOperator::Operation<duckdb::date_t,duckdb::dtime_t,duckdb::timestamp_t>
                                  ((date_t)ldata[uVar7 + uVar8].days,rdata[uVar7 + uVar8].micros);
                result_data[uVar7 + uVar8].value = tVar3.value;
              }
              uVar8 = uVar8 + 1;
              uVar9 = uVar5;
            } while (uVar5 - uVar7 != uVar8);
          }
        }
      }
      uVar4 = uVar4 + 1;
      uVar7 = uVar9;
    } while (uVar4 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}